

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

void __thiscall
jrtplib::RTCPScheduler::RTCPScheduler(RTCPScheduler *this,RTPSources *s,RTPRandom *r)

{
  this->sources = s;
  RTCPSchedulerParams::RTCPSchedulerParams(&this->schedparams);
  (this->nextrtcptime).m_t = 0.0;
  (this->prevrtcptime).m_t = 0.0;
  this->rtprand = r;
  this->headeroverhead = 0;
  this->hassentrtcp = false;
  this->firstcall = true;
  this->avgrtcppacksize = 1000;
  this->byescheduled = false;
  this->sendbyenow = false;
  return;
}

Assistant:

RTCPScheduler::RTCPScheduler(RTPSources &s, RTPRandom &r) : sources(s),nextrtcptime(0,0),prevrtcptime(0,0),rtprand(r)
{
	Reset();

	//std::cout << (void *)(&rtprand) << std::endl;
}